

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.c
# Opt level: O0

int buffer_insert_pages(bfy_buffer *buf,size_t pos,bfy_page *new_pages,size_t new_len)

{
  size_t sVar1;
  bfy_page *pbVar2;
  ulong local_58;
  size_t i;
  size_t new_content_len;
  void *pages;
  size_t pagesize;
  size_t n_pages_alloc;
  size_t new_len_local;
  bfy_page *new_pages_local;
  size_t pos_local;
  bfy_buffer *buf_local;
  
  if ((new_len == 0) || (new_pages == (bfy_page *)0x0)) {
    buf_local._4_4_ = 0;
  }
  else if (((new_len == 1) && (buf->pages == (bfy_page *)0x0)) &&
          ((buf->page).data == (int8_t *)0x0)) {
    memcpy(buf,new_pages,0x38);
    sVar1 = page_get_content_len(new_pages);
    buffer_record_content_added(buf,sVar1);
    buf_local._4_4_ = 0;
  }
  else {
    sVar1 = buffer_count_pages(buf);
    if (buf->n_pages_alloc < sVar1 + new_len) {
      sVar1 = pick_capacity(0x10,sVar1 + new_len);
      pbVar2 = (bfy_page *)(*allocator.realloc)(buf->pages,sVar1 * 0x38);
      if (pbVar2 != (bfy_page *)0x0) {
        buf->pages = pbVar2;
        buf->n_pages_alloc = sVar1;
      }
    }
    if (buf->pages == (bfy_page *)0x0) {
      buf_local._4_4_ = -1;
    }
    else {
      if ((buf->n_pages == 0) && ((buf->page).data != (int8_t *)0x0)) {
        buf->n_pages = 1;
        memcpy(buf->pages,buf,0x38);
        memcpy(buf,&InitPage,0x38);
      }
      sVar1 = size_t_min(pos,buf->n_pages);
      if (sVar1 < buf->n_pages) {
        memmove(buf->pages + sVar1 + new_len,buf->pages + sVar1,(buf->n_pages - sVar1) * 0x38);
      }
      memcpy(buf->pages + sVar1,new_pages,new_len * 0x38);
      buf->n_pages = new_len + buf->n_pages;
      i = 0;
      for (local_58 = 0; local_58 < new_len; local_58 = local_58 + 1) {
        sVar1 = page_get_content_len(new_pages + local_58);
        i = sVar1 + i;
      }
      buffer_record_content_added(buf,i);
      buf_local._4_4_ = 0;
    }
  }
  return buf_local._4_4_;
}

Assistant:

static int
buffer_insert_pages(bfy_buffer* buf, size_t pos,
                    struct bfy_page const* new_pages,
                    size_t new_len) {
    if (new_len == 0 || new_pages == NULL) {
        return 0;
    }

    // if we have nothing, use buf->page
    if (new_len == 1 && buf->pages == NULL && buf->page.data == NULL) {
        buf->page = *new_pages;
        buffer_record_content_added(buf, page_get_content_len(new_pages));
        return 0;
    }

    // ensure we have enough space in buf->pages
    size_t n_pages_alloc = buffer_count_pages(buf) + new_len;
    size_t const pagesize = sizeof(struct bfy_page);
    if (n_pages_alloc > buf->n_pages_alloc) {
        n_pages_alloc = pick_capacity(16, n_pages_alloc);
        void* pages = allocator.realloc(buf->pages, pagesize * n_pages_alloc);
        if (pages != NULL) {
            buf->pages = pages;
            buf->n_pages_alloc = n_pages_alloc;
        }
    }
    if (buf->pages == NULL) {
        return -1;
    }

    // if we had 1 page and are inserting more, handle the special case
    // of moving the single buf->page into the multipage array
    if (buf->n_pages == 0 && buf->page.data != NULL) {
        buf->n_pages = 1;
        *buf->pages = buf->page;
        buf->page = InitPage;
    }

    // insert new_pages into buf->pages
    pos = size_t_min(pos, buf->n_pages);
    if (buf->n_pages > pos) {
        memmove(buf->pages + pos + new_len, buf->pages + pos, pagesize * (buf->n_pages - pos));
    }
    memcpy(buf->pages + pos, new_pages, pagesize * new_len);
    buf->n_pages += new_len;

    // record the new content
    size_t new_content_len = 0;
    for (size_t i = 0; i < new_len; ++i) {
        new_content_len += page_get_content_len(new_pages + i);
    }
    buffer_record_content_added(buf, new_content_len);
    return 0;
}